

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void ColorPhiWeb(VmInstruction *inst,uint color)

{
  VmValue *pVVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstructionType VVar4;
  VmValueType VVar5;
  ulong uVar6;
  VmInstruction *pVVar7;
  VmInstruction *pVVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (inst->color != 0) {
    return;
  }
  inst->color = color;
  VVar4 = inst->cmd;
  if (VVar4 == VM_INST_PHI) {
    if ((inst->arguments).count != 0) {
      uVar12 = 0;
      do {
        pVVar7 = (VmInstruction *)(inst->arguments).data[uVar12];
        if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
          pVVar7 = (VmInstruction *)0x0;
        }
        ColorPhiWeb(pVVar7,color);
        uVar11 = (int)uVar12 + 2;
        uVar12 = (ulong)uVar11;
      } while (uVar11 < (inst->arguments).count);
      VVar4 = inst->cmd;
      goto LAB_00281fd0;
    }
  }
  else {
LAB_00281fd0:
    if (VVar4 == VM_INST_MOV) {
      if ((inst->arguments).count == 0) {
LAB_002821e1:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                     );
      }
      pVVar7 = (VmInstruction *)*(inst->arguments).data;
      if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
        pVVar7 = (VmInstruction *)0x0;
      }
      ColorPhiWeb(pVVar7,color);
      VVar4 = inst->cmd;
    }
    if (VVar4 == VM_INST_DEF) {
      uVar11 = (inst->super_VmValue).users.count;
      if (uVar11 == 0) {
        return;
      }
      uVar12 = 0;
      do {
        pVVar1 = (inst->super_VmValue).users.data[uVar12];
        if ((((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
            (*(int *)&pVVar1[1]._vptr_VmValue == 0x51)) &&
           (VVar5 = pVVar1[1].type.type, VVar5 != VM_TYPE_VOID)) {
          uVar9 = 1;
          do {
            pVVar7 = *(VmInstruction **)(*(long *)&pVVar1[1].typeID + -8 + uVar9 * 8);
            if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
              pVVar7 = (VmInstruction *)0x0;
            }
            uVar6 = (ulong)VVar5;
            if (uVar6 <= uVar9) goto LAB_002821e1;
            pVVar8 = *(VmInstruction **)(*(long *)&pVVar1[1].typeID + uVar9 * 8);
            if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
              if (pVVar7 != (VmInstruction *)0x0) {
                __assert_fail("source",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,7000,"void ColorPhiWeb(VmInstruction *, unsigned int)");
              }
LAB_00282224:
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,6999,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar7 == (VmInstruction *)0x0) goto LAB_00282224;
            if (pVVar7 == inst) {
              ColorPhiWeb(pVVar8,color);
              VVar5 = pVVar1[1].type.type;
              uVar6 = (ulong)VVar5;
            }
            uVar10 = uVar9 + 1;
            uVar9 = uVar9 + 2;
          } while (uVar10 < uVar6);
          uVar11 = (inst->super_VmValue).users.count;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar11);
      goto LAB_002820e0;
    }
  }
  uVar11 = (inst->super_VmValue).users.count;
LAB_002820e0:
  if (uVar11 != 0) {
    uVar12 = 0;
    do {
      pVVar7 = (VmInstruction *)(inst->super_VmValue).users.data[uVar12];
      if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
        pVVar7 = (VmInstruction *)0x0;
      }
      VVar4 = pVVar7->cmd;
      if (VVar4 == VM_INST_PHI) {
        ColorPhiWeb(pVVar7,color);
        VVar4 = pVVar7->cmd;
      }
      if (VVar4 == VM_INST_MOV) {
        ColorPhiWeb(pVVar7,color);
        VVar4 = pVVar7->cmd;
      }
      if ((VVar4 == VM_INST_PARALLEL_COPY) && (uVar11 = (pVVar7->arguments).count, uVar11 != 0)) {
        uVar9 = 1;
        do {
          ppVVar2 = (pVVar7->arguments).data;
          pVVar8 = (VmInstruction *)ppVVar2[uVar9 - 1];
          if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
            pVVar8 = (VmInstruction *)0x0;
          }
          uVar6 = (ulong)uVar11;
          if (uVar6 <= uVar9) goto LAB_002821e1;
          pVVar3 = (VmInstruction *)ppVVar2[uVar9];
          if ((pVVar3 == (VmInstruction *)0x0) || ((pVVar3->super_VmValue).typeID != 2)) {
            if (pVVar8 != (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1b73,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
LAB_002821c2:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1b72,"void ColorPhiWeb(VmInstruction *, unsigned int)");
          }
          if (pVVar8 == (VmInstruction *)0x0) goto LAB_002821c2;
          if (pVVar3 == inst) {
            ColorPhiWeb(pVVar8,color);
            uVar11 = (pVVar7->arguments).count;
            uVar6 = (ulong)uVar11;
          }
          uVar10 = uVar9 + 1;
          uVar9 = uVar9 + 2;
        } while (uVar10 < uVar6);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (inst->super_VmValue).users.count);
  }
  return;
}

Assistant:

void ColorPhiWeb(VmInstruction *inst, unsigned color)
{
	if(inst->color != 0)
		return;

	inst->color = color;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			ColorPhiWeb(instruction, color);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		ColorPhiWeb(instruction, color);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						ColorPhiWeb(source, color);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_MOV)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					ColorPhiWeb(destination, color);
			}
		}
	}
}